

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O0

void BrotliStoreUncompressedMetaBlock
               (int is_final_block,uint8_t *input,size_t position,size_t mask,size_t len,
               size_t *storage_ix,uint8_t *storage)

{
  size_t __n;
  size_t len1;
  size_t masked_pos;
  size_t *storage_ix_local;
  size_t len_local;
  size_t mask_local;
  size_t position_local;
  uint8_t *input_local;
  int is_final_block_local;
  uint64_t v_1;
  uint8_t *p_1;
  uint64_t v;
  uint8_t *p;
  
  len1 = position & mask;
  BrotliStoreUncompressedMetaBlockHeader(len,storage_ix,storage);
  JumpToByteBoundary(storage_ix,storage);
  storage_ix_local = (size_t *)len;
  if (mask + 1 < len1 + len) {
    __n = (mask + 1) - len1;
    memcpy(storage + (*storage_ix >> 3),input + len1,__n);
    *storage_ix = __n * 8 + *storage_ix;
    storage_ix_local = (size_t *)(len - __n);
    len1 = 0;
  }
  memcpy(storage + (*storage_ix >> 3),input + len1,(size_t)storage_ix_local);
  *storage_ix = (long)storage_ix_local * 8 + *storage_ix;
  if ((*storage_ix & 7) == 0) {
    storage[*storage_ix >> 3] = '\0';
    if (is_final_block != 0) {
      *(ulong *)(storage + (*storage_ix >> 3)) =
           1L << ((byte)*storage_ix & 7) | (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
      *storage_ix = *storage_ix + 1;
      *(ulong *)(storage + (*storage_ix >> 3)) =
           1L << ((byte)*storage_ix & 7) | (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
      *storage_ix = *storage_ix + 1;
      JumpToByteBoundary(storage_ix,storage);
    }
    return;
  }
  __assert_fail("(pos & 7) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                ,0x52,"void BrotliWriteBitsPrepareStorage(size_t, uint8_t *)");
}

Assistant:

void BrotliStoreUncompressedMetaBlock(BROTLI_BOOL is_final_block,
                                      const uint8_t * BROTLI_RESTRICT input,
                                      size_t position, size_t mask,
                                      size_t len,
                                      size_t * BROTLI_RESTRICT storage_ix,
                                      uint8_t * BROTLI_RESTRICT storage) {
  size_t masked_pos = position & mask;
  BrotliStoreUncompressedMetaBlockHeader(len, storage_ix, storage);
  JumpToByteBoundary(storage_ix, storage);

  if (masked_pos + len > mask + 1) {
    size_t len1 = mask + 1 - masked_pos;
    memcpy(&storage[*storage_ix >> 3], &input[masked_pos], len1);
    *storage_ix += len1 << 3;
    len -= len1;
    masked_pos = 0;
  }
  memcpy(&storage[*storage_ix >> 3], &input[masked_pos], len);
  *storage_ix += len << 3;

  /* We need to clear the next 4 bytes to continue to be
     compatible with BrotliWriteBits. */
  BrotliWriteBitsPrepareStorage(*storage_ix, storage);

  /* Since the uncompressed block itself may not be the final block, add an
     empty one after this. */
  if (is_final_block) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    JumpToByteBoundary(storage_ix, storage);
  }
}